

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O2

BasicBlock * __thiscall spvtools::opt::BasicBlock::Clone(BasicBlock *this,IRContext *context)

{
  Instruction *pos;
  Instruction *pIVar1;
  BasicBlock *this_00;
  Instruction *this_01;
  Instruction *inst;
  BasicBlock *__range3;
  Instruction *inst_1;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_30;
  
  this_00 = (BasicBlock *)operator_new(0x88);
  local_30._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       Instruction::Clone((this->label_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                          context);
  BasicBlock(this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_30);
  if ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       )local_30._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
      (Instruction *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                8))();
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  pIVar1 = &(this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pos = &(this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    this_01 = Instruction::Clone(pIVar1,context);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (&this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>,pos);
  }
  if ((context->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    pIVar1 = &(this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (pIVar1 = *(Instruction **)
                     ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          pIVar1 != pos) {
      IRContext::set_instr_block(context,pIVar1,this_00);
    }
  }
  return this_00;
}

Assistant:

BasicBlock* BasicBlock::Clone(IRContext* context) const {
  BasicBlock* clone = new BasicBlock(
      std::unique_ptr<Instruction>(GetLabelInst()->Clone(context)));
  for (const auto& inst : insts_) {
    // Use the incoming context
    clone->AddInstruction(std::unique_ptr<Instruction>(inst.Clone(context)));
  }

  if (context->AreAnalysesValid(
          IRContext::Analysis::kAnalysisInstrToBlockMapping)) {
    for (auto& inst : *clone) {
      context->set_instr_block(&inst, clone);
    }
  }

  return clone;
}